

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O3

vbool<8> *
embree::avx::InstanceIntersectorK<8>::occluded
          (vbool<8> *__return_storage_ptr__,vbool<8> *valid_i,Precalculations *pre,RayK<8> *ray,
          RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  anon_struct_32_2_f9fb05de_for_anon_union_32_3_898e2e57_for_vboolf_impl<8>_1_1 aVar14;
  Instance *pIVar15;
  RTCRayQueryContext *pRVar16;
  long lVar17;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  __m128 afVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float in_register_0000151c;
  RayQueryContext newcontext;
  undefined1 local_60 [2] [32];
  
  uVar65 = mm_lookupmask_ps._24_8_;
  uVar64 = mm_lookupmask_ps._16_8_;
  pIVar15 = prim->instance;
  uVar1 = (pIVar15->super_Geometry).mask;
  auVar89._4_4_ = uVar1;
  auVar89._0_4_ = uVar1;
  auVar89._8_4_ = uVar1;
  auVar89._12_4_ = uVar1;
  auVar89._16_4_ = uVar1;
  auVar89._20_4_ = uVar1;
  auVar89._24_4_ = uVar1;
  auVar89._28_4_ = uVar1;
  auVar89 = vandps_avx(auVar89,*(undefined1 (*) [32])(ray + 0x120));
  aVar14 = (valid_i->field_0).field_1;
  auVar19 = vpcmpeqd_avx(auVar89._16_16_,(undefined1  [16])0x0);
  auVar20 = vpcmpeqd_avx(auVar89._0_16_,(undefined1  [16])0x0);
  afVar88 = aVar14.vl;
  auVar90._16_16_ = auVar19;
  auVar90._0_4_ = afVar88[0];
  auVar90._4_4_ = afVar88[1];
  auVar90._8_4_ = afVar88[2];
  auVar90._12_4_ = afVar88[3];
  auVar89 = vblendps_avx(ZEXT1632(auVar20),auVar90,0xf0);
  auVar90 = (undefined1  [32])aVar14 & ~auVar89;
  if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar90 >> 0x7f,0) == '\0') &&
        (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar90 >> 0xbf,0) == '\0') &&
      (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar90[0x1f]) {
    *(undefined8 *)&__return_storage_ptr__->field_0 = mm_lookupmask_ps._16_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar65;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = uVar64;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x18) = uVar65;
  }
  else {
    pRVar16 = context->user;
    *(undefined8 *)&__return_storage_ptr__->field_0 = mm_lookupmask_ps._16_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar65;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = uVar64;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x18) = uVar65;
    if (pRVar16->instID[0] == 0xffffffff) {
      pRVar16->instID[0] = prim->instID_;
      pRVar16->instPrimID[0] = 0;
      local_60[0] = vandnps_avx(auVar89,(undefined1  [32])aVar14);
      fVar2 = (pIVar15->world2local0).l.vx.field_0.m128[0];
      fVar3 = (pIVar15->world2local0).l.vx.field_0.m128[1];
      fVar4 = (pIVar15->world2local0).l.vy.field_0.m128[0];
      fVar5 = (pIVar15->world2local0).l.vy.field_0.m128[1];
      fVar6 = (pIVar15->world2local0).l.vy.field_0.m128[2];
      fVar7 = (pIVar15->world2local0).l.vz.field_0.m128[0];
      fVar8 = (pIVar15->world2local0).l.vz.field_0.m128[1];
      fVar9 = (pIVar15->world2local0).l.vz.field_0.m128[2];
      fVar10 = (pIVar15->world2local0).p.field_0.m128[0];
      fVar11 = (pIVar15->world2local0).p.field_0.m128[1];
      fVar12 = (pIVar15->world2local0).p.field_0.m128[2];
      fVar21 = *(float *)ray;
      fVar22 = *(float *)(ray + 4);
      uVar64 = *(undefined8 *)ray;
      fVar23 = *(float *)(ray + 8);
      fVar24 = *(float *)(ray + 0xc);
      uVar65 = *(undefined8 *)(ray + 8);
      fVar25 = *(float *)(ray + 0x10);
      fVar26 = *(float *)(ray + 0x14);
      uVar66 = *(undefined8 *)(ray + 0x10);
      fVar27 = *(float *)(ray + 0x18);
      uVar67 = *(undefined8 *)(ray + 0x18);
      fVar28 = *(float *)(ray + 0x20);
      fVar29 = *(float *)(ray + 0x24);
      uVar68 = *(undefined8 *)(ray + 0x20);
      fVar30 = *(float *)(ray + 0x28);
      fVar31 = *(float *)(ray + 0x2c);
      uVar69 = *(undefined8 *)(ray + 0x28);
      fVar32 = *(float *)(ray + 0x30);
      fVar33 = *(float *)(ray + 0x34);
      uVar70 = *(undefined8 *)(ray + 0x30);
      fVar34 = *(float *)(ray + 0x38);
      fVar35 = *(float *)(ray + 0x3c);
      uVar71 = *(undefined8 *)(ray + 0x38);
      fVar36 = *(float *)(ray + 0x40);
      fVar37 = *(float *)(ray + 0x44);
      uVar72 = *(undefined8 *)(ray + 0x40);
      fVar38 = *(float *)(ray + 0x48);
      fVar39 = *(float *)(ray + 0x4c);
      uVar73 = *(undefined8 *)(ray + 0x48);
      fVar40 = *(float *)(ray + 0x50);
      fVar41 = *(float *)(ray + 0x54);
      uVar74 = *(undefined8 *)(ray + 0x50);
      fVar42 = *(float *)(ray + 0x58);
      uVar75 = *(undefined8 *)(ray + 0x58);
      fVar13 = (pIVar15->world2local0).l.vx.field_0.m128[2];
      fVar43 = *(float *)(ray + 0x80);
      fVar44 = *(float *)(ray + 0x84);
      uVar76 = *(undefined8 *)(ray + 0x80);
      fVar45 = *(float *)(ray + 0x88);
      fVar46 = *(float *)(ray + 0x8c);
      uVar77 = *(undefined8 *)(ray + 0x88);
      fVar47 = *(float *)(ray + 0x90);
      fVar48 = *(float *)(ray + 0x94);
      uVar78 = *(undefined8 *)(ray + 0x90);
      fVar49 = *(float *)(ray + 0x98);
      uVar79 = *(undefined8 *)(ray + 0x98);
      fVar50 = *(float *)(ray + 0xa0);
      fVar51 = *(float *)(ray + 0xa4);
      uVar80 = *(undefined8 *)(ray + 0xa0);
      fVar52 = *(float *)(ray + 0xa8);
      fVar53 = *(float *)(ray + 0xac);
      uVar81 = *(undefined8 *)(ray + 0xa8);
      fVar54 = *(float *)(ray + 0xb0);
      fVar55 = *(float *)(ray + 0xb4);
      uVar82 = *(undefined8 *)(ray + 0xb0);
      fVar56 = *(float *)(ray + 0xb8);
      uVar83 = *(undefined8 *)(ray + 0xb8);
      fVar57 = *(float *)(ray + 0xc0);
      fVar58 = *(float *)(ray + 0xc4);
      uVar84 = *(undefined8 *)(ray + 0xc0);
      fVar59 = *(float *)(ray + 200);
      fVar60 = *(float *)(ray + 0xcc);
      uVar85 = *(undefined8 *)(ray + 200);
      fVar61 = *(float *)(ray + 0xd0);
      fVar62 = *(float *)(ray + 0xd4);
      uVar86 = *(undefined8 *)(ray + 0xd0);
      fVar63 = *(float *)(ray + 0xd8);
      uVar87 = *(undefined8 *)(ray + 0xd8);
      *(float *)ray = fVar21 * fVar2 + fVar28 * fVar4 + fVar10 + fVar7 * fVar36;
      *(float *)(ray + 4) = fVar22 * fVar2 + fVar29 * fVar4 + fVar10 + fVar7 * fVar37;
      *(float *)(ray + 8) = fVar23 * fVar2 + fVar30 * fVar4 + fVar10 + fVar7 * fVar38;
      *(float *)(ray + 0xc) = fVar24 * fVar2 + fVar31 * fVar4 + fVar10 + fVar7 * fVar39;
      *(float *)(ray + 0x10) = fVar25 * fVar2 + fVar32 * fVar4 + fVar10 + fVar7 * fVar40;
      *(float *)(ray + 0x14) = fVar26 * fVar2 + fVar33 * fVar4 + fVar10 + fVar7 * fVar41;
      *(float *)(ray + 0x18) = fVar27 * fVar2 + fVar34 * fVar4 + fVar10 + fVar7 * fVar42;
      *(float *)(ray + 0x1c) =
           in_register_0000151c + in_register_0000151c + fVar10 + in_register_0000151c;
      *(float *)(ray + 0x20) = fVar21 * fVar3 + fVar28 * fVar5 + fVar11 + fVar36 * fVar8;
      *(float *)(ray + 0x24) = fVar22 * fVar3 + fVar29 * fVar5 + fVar11 + fVar37 * fVar8;
      *(float *)(ray + 0x28) = fVar23 * fVar3 + fVar30 * fVar5 + fVar11 + fVar38 * fVar8;
      *(float *)(ray + 0x2c) = fVar24 * fVar3 + fVar31 * fVar5 + fVar11 + fVar39 * fVar8;
      *(float *)(ray + 0x30) = fVar25 * fVar3 + fVar32 * fVar5 + fVar11 + fVar40 * fVar8;
      *(float *)(ray + 0x34) = fVar26 * fVar3 + fVar33 * fVar5 + fVar11 + fVar41 * fVar8;
      *(float *)(ray + 0x38) = fVar27 * fVar3 + fVar34 * fVar5 + fVar11 + fVar42 * fVar8;
      *(float *)(ray + 0x3c) = fVar35 + in_register_0000151c + fVar11 + in_register_0000151c;
      *(float *)(ray + 0x40) = fVar13 * fVar21 + fVar28 * fVar6 + fVar12 + fVar36 * fVar9;
      *(float *)(ray + 0x44) = fVar13 * fVar22 + fVar29 * fVar6 + fVar12 + fVar37 * fVar9;
      *(float *)(ray + 0x48) = fVar13 * fVar23 + fVar30 * fVar6 + fVar12 + fVar38 * fVar9;
      *(float *)(ray + 0x4c) = fVar13 * fVar24 + fVar31 * fVar6 + fVar12 + fVar39 * fVar9;
      *(float *)(ray + 0x50) = fVar13 * fVar25 + fVar32 * fVar6 + fVar12 + fVar40 * fVar9;
      *(float *)(ray + 0x54) = fVar13 * fVar26 + fVar33 * fVar6 + fVar12 + fVar41 * fVar9;
      *(float *)(ray + 0x58) = fVar13 * fVar27 + fVar34 * fVar6 + fVar12 + fVar42 * fVar9;
      *(float *)(ray + 0x5c) = fVar35 + in_register_0000151c + fVar12 + in_register_0000151c;
      *(float *)(ray + 0x80) = fVar43 * fVar2 + fVar7 * fVar57 + fVar50 * fVar4;
      *(float *)(ray + 0x84) = fVar44 * fVar2 + fVar7 * fVar58 + fVar51 * fVar4;
      *(float *)(ray + 0x88) = fVar45 * fVar2 + fVar7 * fVar59 + fVar52 * fVar4;
      *(float *)(ray + 0x8c) = fVar46 * fVar2 + fVar7 * fVar60 + fVar53 * fVar4;
      *(float *)(ray + 0x90) = fVar47 * fVar2 + fVar7 * fVar61 + fVar54 * fVar4;
      *(float *)(ray + 0x94) = fVar48 * fVar2 + fVar7 * fVar62 + fVar55 * fVar4;
      *(float *)(ray + 0x98) = fVar49 * fVar2 + fVar7 * fVar63 + fVar56 * fVar4;
      *(float *)(ray + 0x9c) = fVar2 + fVar7 + fVar4;
      *(float *)(ray + 0xa0) = fVar43 * fVar3 + fVar50 * fVar5 + fVar57 * fVar8;
      *(float *)(ray + 0xa4) = fVar44 * fVar3 + fVar51 * fVar5 + fVar58 * fVar8;
      *(float *)(ray + 0xa8) = fVar45 * fVar3 + fVar52 * fVar5 + fVar59 * fVar8;
      *(float *)(ray + 0xac) = fVar46 * fVar3 + fVar53 * fVar5 + fVar60 * fVar8;
      *(float *)(ray + 0xb0) = fVar47 * fVar3 + fVar54 * fVar5 + fVar61 * fVar8;
      *(float *)(ray + 0xb4) = fVar48 * fVar3 + fVar55 * fVar5 + fVar62 * fVar8;
      *(float *)(ray + 0xb8) = fVar49 * fVar3 + fVar56 * fVar5 + fVar63 * fVar8;
      *(float *)(ray + 0xbc) = fVar3 + fVar5 + fVar8;
      *(float *)(ray + 0xc0) = fVar13 * fVar43 + fVar50 * fVar6 + fVar57 * fVar9;
      *(float *)(ray + 0xc4) = fVar13 * fVar44 + fVar51 * fVar6 + fVar58 * fVar9;
      *(float *)(ray + 200) = fVar13 * fVar45 + fVar52 * fVar6 + fVar59 * fVar9;
      *(float *)(ray + 0xcc) = fVar13 * fVar46 + fVar53 * fVar6 + fVar60 * fVar9;
      *(float *)(ray + 0xd0) = fVar13 * fVar47 + fVar54 * fVar6 + fVar61 * fVar9;
      *(float *)(ray + 0xd4) = fVar13 * fVar48 + fVar55 * fVar6 + fVar62 * fVar9;
      *(float *)(ray + 0xd8) = fVar13 * fVar49 + fVar56 * fVar6 + fVar63 * fVar9;
      *(float *)(ray + 0xdc) = fVar5 + fVar8 + fVar6 + fVar9;
      lVar17 = *(long *)&(pIVar15->super_Geometry).field_0x58;
      (**(code **)(lVar17 + 0xe8))(local_60,lVar17 + 0x58,ray);
      *(undefined8 *)ray = uVar64;
      *(undefined8 *)(ray + 8) = uVar65;
      *(undefined8 *)(ray + 0x10) = uVar66;
      *(undefined8 *)(ray + 0x18) = uVar67;
      *(undefined8 *)(ray + 0x20) = uVar68;
      *(undefined8 *)(ray + 0x28) = uVar69;
      *(undefined8 *)(ray + 0x30) = uVar70;
      *(undefined8 *)(ray + 0x38) = uVar71;
      *(undefined8 *)(ray + 0x40) = uVar72;
      *(undefined8 *)(ray + 0x48) = uVar73;
      *(undefined8 *)(ray + 0x50) = uVar74;
      *(undefined8 *)(ray + 0x58) = uVar75;
      *(undefined8 *)(ray + 0x80) = uVar76;
      *(undefined8 *)(ray + 0x88) = uVar77;
      *(undefined8 *)(ray + 0x90) = uVar78;
      *(undefined8 *)(ray + 0x98) = uVar79;
      *(undefined8 *)(ray + 0xa0) = uVar80;
      *(undefined8 *)(ray + 0xa8) = uVar81;
      *(undefined8 *)(ray + 0xb0) = uVar82;
      *(undefined8 *)(ray + 0xb8) = uVar83;
      *(undefined8 *)(ray + 0xc0) = uVar84;
      *(undefined8 *)(ray + 200) = uVar85;
      *(undefined8 *)(ray + 0xd0) = uVar86;
      *(undefined8 *)(ray + 0xd8) = uVar87;
      aVar18 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)
               vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40),1);
      __return_storage_ptr__->field_0 = aVar18;
      pRVar16->instID[0] = 0xffffffff;
      pRVar16->instPrimID[0] = 0xffffffff;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vbool<K> InstanceIntersectorK<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      vbool<K> valid = valid_i;
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local();
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;    
    }